

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O1

void start_game_proc(Am_Object param_1)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  Am_Value *pAVar4;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Set(0x82e8,true,0);
  pAVar4 = (Am_Value *)Am_Object::Get(0x82c0,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Set(0x82e0,100,(ulong)(uint)((iVar2 - (iVar2 + -0x15 >> 0x1f)) + -0x15 >> 1));
  pAVar4 = (Am_Value *)Am_Object::Get(0x82c8,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Set(0x82e0,0x65,(ulong)(uint)((iVar2 - (iVar2 + -0x15 >> 0x1f)) + -0x15 >> 1));
  Am_Object::Set(0x82e0,true,1);
  pAVar4 = (Am_Value *)Am_Object::Get(0x82c8,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Set(0x82d0,0x65,(ulong)(uint)((iVar2 - (iVar2 + -0x3c >> 0x1f)) + -0x3c >> 1));
  pAVar4 = (Am_Value *)Am_Object::Get(0x82c8,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Set(0x82d8,0x65,(ulong)(uint)((iVar2 - (iVar2 + -0x3c >> 0x1f)) + -0x3c >> 1));
  uVar3 = rand();
  y_offset = (uVar3 & 7) + 1;
  uVar3 = rand();
  if ((uVar3 & 1) != 0) {
    y_offset = -y_offset;
  }
  uVar3 = rand();
  x_offset = (uVar3 & 7) + 1;
  if (player1sturn == true) {
    x_offset = ~(uVar3 & 7);
  }
  Am_Object::Am_Object(&local_18,&anim);
  Am_Object::Am_Object(&local_20,(Am_Object *)&Am_No_Object);
  uVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_28,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor(&local_18,&local_20,uVar1,&local_28,0,0,1);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, start_game, (Am_Object /*cmd*/))
{
  start_button.Set(Am_VISIBLE, false);
  ball.Set(Am_LEFT, (int)((int)window.Get(Am_WIDTH) - ball_size) / 2);
  ball.Set(Am_TOP, (int)((int)main_group.Get(Am_HEIGHT) - ball_size) / 2);
  ball.Set(Am_VISIBLE, true);
  paddle1.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  paddle2.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  y_offset = (rand() & 7) + 1;
  if (rand() & 1)
    y_offset = -y_offset;
  x_offset = (rand() & 7) + 1;
  if (player1sturn)
    x_offset = -x_offset;
  Am_Start_Interactor(anim);
}